

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

QString * defaultLibexecDir(void)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1.m_data = (storage_type_conflict *)0x7;
  QVar1.m_size = (qsizetype)&local_38;
  QString::fromLatin1(QVar1);
  *(undefined4 *)&(in_RDI->d).d = local_38;
  *(undefined4 *)((long)&(in_RDI->d).d + 4) = uStack_34;
  *(undefined4 *)&(in_RDI->d).ptr = uStack_30;
  *(undefined4 *)((long)&(in_RDI->d).ptr + 4) = uStack_2c;
  (in_RDI->d).size = local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString defaultLibexecDir()
{
#ifdef Q_OS_WIN32
    return "bin"_L1;
#else
    return "libexec"_L1;
#endif
}